

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

string * __thiscall
cmTarget::GetSupportDirectory_abi_cxx11_(string *__return_storage_ptr__,cmTarget *this)

{
  char *pcVar1;
  allocator local_11;
  
  pcVar1 = cmMakefile::GetCurrentBinaryDirectory(this->Makefile);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_11);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(this->Name)._M_dataplus._M_p);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::GetSupportDirectory() const
{
  std::string dir = this->Makefile->GetCurrentBinaryDirectory();
  dir += cmake::GetCMakeFilesDirectory();
  dir += "/";
  dir += this->Name;
#if defined(__VMS)
  dir += "_dir";
#else
  dir += ".dir";
#endif
  return dir;
}